

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O0

void __thiscall
cfgfile::tag_scalar_t<QString,_cfgfile::qstring_trait_t>::print
          (tag_scalar_t<QString,_cfgfile::qstring_trait_t> *this,QDomDocument *doc,
          QDomElement *parent)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  reference pptVar3;
  char16_t *in_RDX;
  qsizetype in_RSI;
  tag_t<cfgfile::qstring_trait_t> *in_RDI;
  tag_t<cfgfile::qstring_trait_t> *tag;
  const_iterator __end0;
  const_iterator __begin0;
  child_tags_list_t *__range4;
  QDomText data;
  string_t value;
  QDomElement this_element;
  QString *in_stack_fffffffffffffec8;
  qstring_wrapper_t *in_stack_fffffffffffffed0;
  vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
  *this_00;
  tag_t<cfgfile::qstring_trait_t> *in_stack_fffffffffffffee8;
  __normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
  local_d8;
  __normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
  *local_d0;
  QDomNode local_c8 [32];
  undefined1 local_a8 [80];
  QDomNode local_58 [8];
  QDomNode local_50 [48];
  QString local_20;
  __normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
  *__lhs;
  
  local_20.d.ptr = in_RDX;
  local_20.d.size = in_RSI;
  bVar1 = tag_t<cfgfile::qstring_trait_t>::is_defined(in_stack_fffffffffffffee8);
  if (bVar1) {
    tag_t<cfgfile::qstring_trait_t>::name(in_RDI);
    qstring_wrapper_t::operator_cast_to_QString((qstring_wrapper_t *)in_stack_fffffffffffffec8);
    QDomDocument::createElement(&local_20);
    QString::~QString((QString *)0x11149c);
    if (local_20.d.ptr == (char16_t *)0x0) {
      QDomNode::appendChild(local_50);
      QDomNode::~QDomNode(local_50);
    }
    else {
      QDomNode::appendChild(local_58);
      QDomNode::~QDomNode(local_58);
    }
    qstring_wrapper_t::qstring_wrapper_t(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    format_t<cfgfile::qstring_wrapper_t,_cfgfile::qstring_trait_t>::to_string
              ((string_t *)in_stack_fffffffffffffec8);
    qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x11157c);
    to_cfgfile_format<cfgfile::qstring_trait_t>((string_t *)value.m_str.d.d);
    this_00 = (vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
               *)(local_a8 + 8);
    qstring_wrapper_t::operator=
              (in_stack_fffffffffffffed0,(qstring_wrapper_t *)in_stack_fffffffffffffec8);
    qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x1115bc);
    qstring_wrapper_t::operator_cast_to_QString((qstring_wrapper_t *)in_stack_fffffffffffffec8);
    QDomDocument::createTextNode((QString *)local_a8);
    QString::~QString((QString *)0x111600);
    QDomNode::appendChild(local_c8);
    QDomNode::~QDomNode(local_c8);
    (*in_RDI->_vptr_tag_t[2])();
    bVar1 = std::
            vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
            ::empty(this_00);
    if (!bVar1) {
      iVar2 = (*in_RDI->_vptr_tag_t[2])();
      __lhs = (__normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
               *)CONCAT44(extraout_var,iVar2);
      local_d0 = __lhs;
      local_d8._M_current =
           (tag_t<cfgfile::qstring_trait_t> **)
           std::
           vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
           ::begin((vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
                    *)in_stack_fffffffffffffec8);
      std::
      vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
      ::end((vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
             *)in_stack_fffffffffffffec8);
      while (bVar1 = __gnu_cxx::operator!=
                               (__lhs,(__normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
                                       *)in_stack_fffffffffffffec8), bVar1) {
        pptVar3 = __gnu_cxx::
                  __normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
                  ::operator*(&local_d8);
        (*(*pptVar3)->_vptr_tag_t[4])(*pptVar3,local_20.d.size,&local_20);
        __gnu_cxx::
        __normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
        ::operator++(&local_d8);
      }
    }
    QDomText::~QDomText((QDomText *)0x111770);
    qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x11177d);
    QDomElement::~QDomElement((QDomElement *)0x11178a);
  }
  return;
}

Assistant:

void print( QDomDocument & doc, QDomElement * parent = 0 ) const override
	{
		if( this->is_defined() )
		{
			QDomElement this_element = doc.createElement( this->name() );

			if( !parent )
				doc.appendChild( this_element );
			else
				parent->appendChild( this_element );

			typename Trait::string_t value =
				format_t< typename Trait::string_t, Trait >::to_string( m_value );
			value = to_cfgfile_format< Trait >( value );

			QDomText data = doc.createTextNode( value );

			this_element.appendChild( data );

			if( !this->children().empty() )
			{
				for( const tag_t< Trait > * tag : this->children() )
					tag->print( doc, &this_element );
			}
		}
	}